

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

size_t __thiscall
TransitionObservationIndependentMADPDiscrete::CreateJointActionsRecursively
          (TransitionObservationIndependentMADPDiscrete *this,Index curAgentI,
          JointActionDiscrete *ja,Index jaI)

{
  ulong uVar1;
  TransitionObservationIndependentMADPDiscrete *__x;
  size_t sVar2;
  uint in_ECX;
  TransitionObservationIndependentMADPDiscrete *in_RDX;
  uint in_ESI;
  vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *in_RDI;
  ActionDiscrete *adp;
  Index a;
  JointActionDiscrete *p_ja;
  JointActionDiscrete *p_jaReceivedArgCopy;
  size_t nrA;
  bool lastAgent;
  Index in_stack_00000154;
  ActionDiscrete *in_stack_00000158;
  JointActionDiscrete *in_stack_00000160;
  Index in_stack_ffffffffffffff88;
  Index in_stack_ffffffffffffff8c;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffff90;
  uint local_4c;
  TransitionObservationIndependentMADPDiscrete *local_48;
  JointActionDiscrete *in_stack_ffffffffffffffc8;
  JointActionDiscrete *in_stack_ffffffffffffffd0;
  TransitionObservationIndependentMADPDiscrete *this_00;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = (uint)in_stack_ffffffffffffffe0;
  if ((ulong)in_ESI ==
      (long)in_RDI[3].
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish - 1U) {
    uVar3 = CONCAT13(1,in_stack_ffffffffffffffe0);
  }
  uVar1 = (*(code *)(in_RDI->
                    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[9])(in_RDI,in_ESI);
  __x = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x48);
  JointActionDiscrete::JointActionDiscrete(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = __x;
  for (local_4c = 0; local_4c < uVar1; local_4c = local_4c + 1) {
    GetIndividualMADPD(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    MultiAgentDecisionProcessDiscrete::GetActionDiscrete
              ((MultiAgentDecisionProcessDiscrete *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    local_48 = in_RDX;
    if ((local_4c != 0) && (local_48 = this_00, (ulong)local_4c != uVar1 - 1)) {
      in_stack_ffffffffffffff90 = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x48)
      ;
      JointActionDiscrete::JointActionDiscrete
                ((JointActionDiscrete *)this_00,in_stack_ffffffffffffffc8);
      local_48 = in_stack_ffffffffffffff90;
    }
    if ((uVar3 & 0x1000000) != 0) {
      DiscreteEntity::SetIndex
                ((DiscreteEntity *)&(local_48->super_MultiAgentDecisionProcess)._m_name,in_ECX);
    }
    JointActionDiscrete::AddIndividualAction(in_stack_00000160,in_stack_00000158,in_stack_00000154);
    if ((uVar3 & 0x1000000) == 0) {
      sVar2 = CreateJointActionsRecursively
                        ((TransitionObservationIndependentMADPDiscrete *)
                         CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Index)((ulong)in_RDX >> 0x20),
                         (JointActionDiscrete *)CONCAT44(in_ECX,uVar3),(Index)(uVar1 >> 0x20));
      in_ECX = (uint)sVar2;
    }
    else {
      std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::push_back
                (in_RDI,(value_type *)__x);
      in_ECX = in_ECX + 1;
    }
  }
  return (ulong)in_ECX;
}

Assistant:

size_t TransitionObservationIndependentMADPDiscrete::
CreateJointActionsRecursively(Index curAgentI, JointActionDiscrete& ja, 
        Index jaI)
{
if(DEBUG_CJA)    cerr << "TransitionObservationIndependentMADPDiscrete::CreateJointActions(Index "<<curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") called"<<endl;

    bool lastAgent=false;
    if(curAgentI == _m_nrAgents-1)
    {
        lastAgent = true;    
        if(DEBUG_CJA)     cerr << "\nlast agent\n";
    }

    //we are going to walk through this agents action vector
    size_t nrA = GetNrActions(curAgentI);
    
    //first action extends the received ja 
    JointActionDiscrete* p_jaReceivedArgCopy = new JointActionDiscrete(ja);
    JointActionDiscrete* p_ja;
    
    for(Index a=0; a < nrA; a++)
    {
        const ActionDiscrete * adp = GetIndividualMADPD(curAgentI)->
            GetActionDiscrete(0, a);
        if(DEBUG_CJA) cerr << "\nnext action";
//        if(it == first) //
        if(a == 0)      
        {
            if(DEBUG_CJA) cerr << "(first action - not making copy)\n";
            p_ja = &ja;
        }
        else if ( a == nrA-1 )//it == beforelast)
            //this is the last last action   
        {
            if(DEBUG_CJA) cerr << "(last action - not making copy)\n";
            p_ja = p_jaReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            if(DEBUG_CJA) cerr << "(intermed. action - making copy)\n";
            p_ja = new JointActionDiscrete(*p_jaReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_ja->SetIndex(jaI);
            if(DEBUG_CJA)cerr << "setting index of this joint action to: "<< 
                jaI <<endl;
        }
//        ActionDiscrete* adp = /*(ActionDiscrete*)*/ &(*it);
        if(DEBUG_CJA)
            cerr <<"Adding agent's indiv. action to joint action..."<<endl;
        p_ja->AddIndividualAction(adp, curAgentI);        
        if(lastAgent) //jointAction is now completed: add it to jointAction set.
        {
            if(DEBUG_CJA){cerr << "INSERTING the joint action:"; 
                p_ja->Print();cerr<<endl;}
            _m_jointActionVec.push_back(p_ja);
            if(DEBUG_CJA){cerr << "\nINSERTED the joint action."<<endl;
                cerr << "_m_jointActionVec now containts "<< 
                _m_jointActionVec.size() << " joint actions." << endl;}
            jaI++;
        }
        else
            jaI = CreateJointActionsRecursively(curAgentI+1,*p_ja, jaI);
        
//        it++;
    }
    if(DEBUG_CJA)    cerr << ">>ProblemDecTiger::CreateJointActionsRecursively(Index "<<curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") FINISHED"<<endl;
    return jaI;
}